

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPE.cc
# Opt level: O1

void __thiscall
onmt::BPE::recursive_split
          (BPE *this,Token *piece,vector<onmt::Token,_std::allocator<onmt::Token>_> *pieces_in_vocab
          ,bool first,bool last)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  const_iterator cVar5;
  Token left_piece;
  string bpe_surface;
  Token local_178;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  Token local_c0;
  Token local_78;
  
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pcVar3 = (piece->surface)._M_dataplus._M_p;
  local_130 = pieces_in_vocab;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar3,pcVar3 + (piece->surface)._M_string_length);
  if ((this->_prefix & first) == 1) {
    std::operator+(&local_178.surface,&this->_begin_of_word,&local_128);
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.surface._M_dataplus._M_p != &local_178.surface.field_2) {
      operator_delete(local_178.surface._M_dataplus._M_p,
                      local_178.surface.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->_suffix & last) == 1) {
    std::operator+(&local_178.surface,&local_128,&this->_end_of_word);
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.surface._M_dataplus._M_p != &local_178.surface.field_2) {
      operator_delete(local_178.surface._M_dataplus._M_p,
                      local_178.surface.field_2._M_allocated_capacity + 1);
    }
    local_108 = (this->_end_of_word)._M_string_length;
  }
  else {
    local_108 = 0;
  }
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_codes_reverse)._M_h,&local_128);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
              (local_130,piece);
    goto LAB_001a5291;
  }
  std::__cxx11::string::substr
            ((ulong)&local_e0,
             (long)cVar5.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                   ._M_cur + 0x28);
  local_178.surface._M_dataplus._M_p = (pointer)&local_178.surface.field_2;
  if (local_e0 == &local_d0) {
    local_178.surface.field_2._8_8_ = local_d0._8_8_;
  }
  else {
    local_178.surface._M_dataplus._M_p = (pointer)local_e0;
  }
  local_178.surface.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
  local_178.surface.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
  local_178.surface._M_string_length = local_d8;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_178.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.type = Word;
  local_178.casing = None;
  if (first) {
    local_178._40_2_ = CONCAT11(1,piece->join_left);
    local_178._40_3_ = CONCAT12(0,local_178._40_2_);
    if (piece->join_left != true) goto LAB_001a4fbd;
    local_178.preserve = piece->preserve;
  }
  else {
    local_178._40_3_ = 0x100;
LAB_001a4fbd:
    local_178.preserve = false;
  }
  local_e0 = &local_d0;
  bVar4 = in_vocabulary(this,&local_178,first,false);
  if (bVar4) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
              (local_130,&local_178);
  }
  else {
    paVar2 = &local_78.surface.field_2;
    paVar1 = &local_178.surface.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.surface._M_dataplus._M_p == paVar1) {
      local_78.surface.field_2._8_8_ = local_178.surface.field_2._8_8_;
      local_78.surface._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_78.surface._M_dataplus._M_p = local_178.surface._M_dataplus._M_p;
    }
    local_78.surface.field_2._M_allocated_capacity = local_178.surface.field_2._M_allocated_capacity
    ;
    local_78.surface._M_string_length = local_178.surface._M_string_length;
    local_178.surface._M_string_length = 0;
    local_178.surface.field_2._M_allocated_capacity =
         local_178.surface.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_78.type = local_178.type;
    local_78.casing = local_178.casing;
    local_78.join_left = local_178.join_left;
    local_78.join_right = local_178.join_right;
    local_78.spacer = local_178.spacer;
    local_78.preserve = local_178.preserve;
    local_78.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_178.features.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_78.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_178.features.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_78.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_178.features.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_178.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.surface._M_dataplus._M_p = (pointer)paVar1;
    recursive_split(this,&local_78,local_130,first,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78.features);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.surface._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.surface._M_dataplus._M_p,
                      local_78.surface.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.features);
  paVar1 = &local_178.surface.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.surface._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.surface._M_dataplus._M_p,
                    local_178.surface.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::substr
            ((ulong)&local_100,
             (long)cVar5.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                   ._M_cur + 0x48);
  if (local_100 == &local_f0) {
    local_178.surface.field_2._8_8_ = local_f0._8_8_;
    local_178.surface._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_178.surface._M_dataplus._M_p = (pointer)local_100;
  }
  local_178.surface.field_2._M_allocated_capacity._1_7_ = local_f0._M_allocated_capacity._1_7_;
  local_178.surface.field_2._M_local_buf[0] = local_f0._M_local_buf[0];
  local_178.surface._M_string_length = local_f8;
  local_f8 = 0;
  local_f0._M_local_buf[0] = '\0';
  local_178.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.type = Word;
  local_178.casing = None;
  if (last) {
    local_178._40_3_ = (uint3)piece->join_right << 8;
    if (piece->join_right != true) goto LAB_001a517f;
    local_178.preserve = piece->preserve;
  }
  else {
    local_178._40_3_ = 0x100;
LAB_001a517f:
    local_178.preserve = false;
  }
  local_100 = &local_f0;
  bVar4 = in_vocabulary(this,&local_178,false,last);
  if (bVar4) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
              (local_130,&local_178);
  }
  else {
    paVar2 = &local_c0.surface.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.surface._M_dataplus._M_p == paVar1) {
      local_c0.surface.field_2._8_8_ = local_178.surface.field_2._8_8_;
      local_c0.surface._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_c0.surface._M_dataplus._M_p = local_178.surface._M_dataplus._M_p;
    }
    local_c0.surface.field_2._M_allocated_capacity = local_178.surface.field_2._M_allocated_capacity
    ;
    local_c0.surface._M_string_length = local_178.surface._M_string_length;
    local_178.surface._M_string_length = 0;
    local_178.surface.field_2._M_allocated_capacity =
         local_178.surface.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_c0.type = local_178.type;
    local_c0.casing = local_178.casing;
    local_c0.join_left = local_178.join_left;
    local_c0.join_right = local_178.join_right;
    local_c0.spacer = local_178.spacer;
    local_c0.preserve = local_178.preserve;
    local_c0.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_178.features.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c0.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_178.features.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c0.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_178.features.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_178.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.surface._M_dataplus._M_p = (pointer)paVar1;
    recursive_split(this,&local_c0,local_130,false,last);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0.features);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.surface._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0.surface._M_dataplus._M_p,
                      local_c0.surface.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.features);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.surface._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.surface._M_dataplus._M_p,
                    local_178.surface.field_2._M_allocated_capacity + 1);
  }
LAB_001a5291:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BPE::recursive_split(Token piece,
                            std::vector<Token>& pieces_in_vocab,
                            const bool first,
                            const bool last) const
  {
    // Recursively split segment into smaller units (by reversing BPE merges)
    // until all units are either in - vocabulary, or cannot be split further.
    std::string bpe_surface = piece.surface;
    size_t left_offset = 0;
    size_t right_offset = 0;
    if (_prefix && first)
    {
      bpe_surface = _begin_of_word + bpe_surface;
      left_offset = _begin_of_word.size();
    }
    if (_suffix && last)
    {
      bpe_surface = bpe_surface + _end_of_word;
      right_offset = _end_of_word.size();
    }

    auto it = _codes_reverse.find(bpe_surface);
    if (it == _codes_reverse.end())
    {
      pieces_in_vocab.emplace_back(std::move(piece));
      return;
    }

    const auto& pair = it->second;

    {
      Token left_piece(pair.first.substr(left_offset));
      left_piece.join_left = first && piece.join_left;
      left_piece.join_right = true;
      left_piece.preserve = first && piece.join_left && piece.preserve;

      if (in_vocabulary(left_piece, first, false))
        pieces_in_vocab.emplace_back(std::move(left_piece));
      else
        recursive_split(std::move(left_piece), pieces_in_vocab, first, false);
    }

    {
      Token right_piece(pair.second.substr(0, pair.second.size() - right_offset));
      right_piece.join_left = false;
      right_piece.join_right = !last || piece.join_right;
      right_piece.preserve = last && piece.join_right && piece.preserve;

      if (in_vocabulary(right_piece, false, last))
        pieces_in_vocab.emplace_back(std::move(right_piece));
      else
        recursive_split(std::move(right_piece), pieces_in_vocab, false, last);
    }
  }